

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::generateProgramOutputTypeBlockContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               deUint32 presentShadersMask)

{
  NodeType NVar1;
  ShaderType SVar2;
  TestCaseGroup *pTVar3;
  ArrayElement *pAVar4;
  InterpolationQualifier *this;
  StorageQualifier *pSVar5;
  Node *pNVar6;
  int expandLevel;
  SharedPtr arrayElem;
  SharedPtr arrayElement;
  SharedPtr output;
  
  pNVar6 = parentStructure->m_ptr;
  NVar1 = pNVar6->m_type;
  if (NVar1 == TYPE_DEFAULT_BLOCK) {
    pSVar5 = (StorageQualifier *)operator_new(0x28);
    ResourceDefinition::StorageQualifier::StorageQualifier(pSVar5,parentStructure,STORAGE_OUT);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&output,(Node *)pSVar5);
  }
  else {
    output.m_state = parentStructure->m_state;
    output.m_ptr = pNVar6;
    if (output.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (output.m_state)->strongRefCount = (output.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (output.m_state)->weakRefCount = (output.m_state)->weakRefCount + 1;
      UNLOCK();
    }
  }
  SVar2 = getShaderMaskLastStage(presentShadersMask);
  if (((NVar1 == TYPE_DEFAULT_BLOCK) && (SVar2 != SHADERTYPE_TESSELLATION_EVALUATION)) &&
     ((SVar2 & ~SHADERTYPE_GEOMETRY) != SHADERTYPE_VERTEX)) {
    if (SVar2 == SHADERTYPE_TESSELLATION_CONTROL) {
      pSVar5 = (StorageQualifier *)operator_new(0x28);
      ResourceDefinition::StorageQualifier::StorageQualifier
                (pSVar5,parentStructure,STORAGE_PATCH_OUT);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&arrayElement,(Node *)pSVar5);
      pAVar4 = (ArrayElement *)operator_new(0x28);
      ResourceDefinition::ArrayElement::ArrayElement(pAVar4,&output,-2);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&arrayElem,(Node *)pAVar4);
      pTVar3 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup(pTVar3,context,"basic_type","Basic types");
      tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar3);
      generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
                (context,&arrayElem,(TestCaseGroup *)pTVar3,true,2);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&arrayElem);
      pTVar3 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup(pTVar3,context,"patch_var","Basic types, per-patch");
      tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar3);
      generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
                (context,&arrayElement,(TestCaseGroup *)pTVar3,true,1);
      pNVar6 = (Node *)operator_new(0x20);
      ResourceDefinition::StructMember::StructMember((StructMember *)pNVar6,&arrayElement);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&arrayElem,pNVar6);
      pTVar3 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup(pTVar3,context,"patch_var_struct","Struct types, per-patch");
      tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar3);
      generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
                (context,&arrayElem,(TestCaseGroup *)pTVar3,true,1);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&arrayElem);
      pAVar4 = (ArrayElement *)operator_new(0x28);
      ResourceDefinition::ArrayElement::ArrayElement(pAVar4,&arrayElement,-1);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&arrayElem,(Node *)pAVar4);
      pTVar3 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup(pTVar3,context,"patch_var_array","Array types, per-patch");
      tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar3);
      generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
                (context,&arrayElem,(TestCaseGroup *)pTVar3,true,1);
      goto LAB_00508b6a;
    }
    if (SVar2 != SHADERTYPE_FRAGMENT) goto LAB_00508b7e;
    pTVar3 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup(pTVar3,context,"basic_type","Basic types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar3);
    generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
              (context,&output,(TestCaseGroup *)pTVar3,false,2);
    pAVar4 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar4,&output,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&arrayElement,(Node *)pAVar4);
    pTVar3 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup(pTVar3,context,"array","Array types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar3);
    generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
              (context,&arrayElement,(TestCaseGroup *)pTVar3,false,2);
  }
  else {
    this = (InterpolationQualifier *)operator_new(0x28);
    arrayElem.m_ptr._0_4_ = 1;
    ResourceDefinition::InterpolationQualifier::InterpolationQualifier
              (this,&output,(Interpolation *)&arrayElem);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&arrayElement,(Node *)this);
    pTVar3 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup(pTVar3,context,"basic_type","Basic types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar3);
    generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
              (context,&arrayElement,(TestCaseGroup *)pTVar3,true,(NVar1 == TYPE_DEFAULT_BLOCK) + 1)
    ;
    pAVar4 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar4,&arrayElement,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&arrayElem,(Node *)pAVar4);
    pTVar3 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup(pTVar3,context,"array","Array types");
    expandLevel = (uint)(NVar1 == TYPE_DEFAULT_BLOCK) + (uint)(SVar2 == SHADERTYPE_VERTEX);
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar3);
    generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
              (context,&arrayElem,(TestCaseGroup *)pTVar3,true,expandLevel);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&arrayElem);
    pNVar6 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar6,&arrayElement);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&arrayElem,pNVar6);
    pTVar3 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup(pTVar3,context,"struct","Struct types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar3);
    generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
              (context,&arrayElem,(TestCaseGroup *)pTVar3,true,expandLevel);
LAB_00508b6a:
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&arrayElem);
  }
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&arrayElement);
LAB_00508b7e:
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&output);
  return;
}

Assistant:

static void generateProgramOutputTypeBlockContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, deUint32 presentShadersMask)
{
	const bool									inDefaultBlock						= parentStructure->getType() == ResourceDefinition::Node::TYPE_DEFAULT_BLOCK;
	const ResourceDefinition::Node::SharedPtr	output								= (inDefaultBlock)
																						? (ResourceDefinition::Node::SharedPtr(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_OUT)))
																						: (parentStructure);
	const glu::ShaderType						lastStage							= getShaderMaskLastStage(presentShadersMask);
	const int									interfaceBlockExpansionReducement	= (!inDefaultBlock) ? (1) : (0); // lesser expansions on block members to keep test counts reasonable

	if (lastStage == glu::SHADERTYPE_VERTEX						||
		lastStage == glu::SHADERTYPE_GEOMETRY					||
		lastStage == glu::SHADERTYPE_TESSELLATION_EVALUATION	||
		!inDefaultBlock)
	{
		const ResourceDefinition::Node::SharedPtr flatShading(new ResourceDefinition::InterpolationQualifier(output, glu::INTERPOLATION_FLAT));

		// Only basic types, arrays of basic types, struct of basic types (and no booleans)
		{
			tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "basic_type", "Basic types");
			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, flatShading, blockGroup, true, 2 - interfaceBlockExpansionReducement);
		}
		{
			const ResourceDefinition::Node::SharedPtr	arrayElement			(new ResourceDefinition::ArrayElement(flatShading));
			tcu::TestCaseGroup* const					blockGroup				= new TestCaseGroup(context, "array", "Array types");
			const int									typeExpansionReducement	= (lastStage != glu::SHADERTYPE_VERTEX) ? (1) : (0); // lesser expansions on other stages
			const int									expansionLevel			= 2 - interfaceBlockExpansionReducement - typeExpansionReducement;

			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, arrayElement, blockGroup, true, expansionLevel);
		}
		{
			const ResourceDefinition::Node::SharedPtr	structMember			(new ResourceDefinition::StructMember(flatShading));
			tcu::TestCaseGroup* const					blockGroup				= new TestCaseGroup(context, "struct", "Struct types");
			const int									typeExpansionReducement	= (lastStage != glu::SHADERTYPE_VERTEX) ? (1) : (0); // lesser expansions on other stages
			const int									expansionLevel			= 2 - interfaceBlockExpansionReducement - typeExpansionReducement;

			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, structMember, blockGroup, true, expansionLevel);
		}
	}
	else if (lastStage == glu::SHADERTYPE_FRAGMENT)
	{
		// only basic type and basic type array (and no booleans or matrices)
		{
			tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "basic_type", "Basic types");
			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, output, blockGroup, false, 2);
		}
		{
			const ResourceDefinition::Node::SharedPtr	arrayElement	(new ResourceDefinition::ArrayElement(output));
			tcu::TestCaseGroup* const					blockGroup		= new TestCaseGroup(context, "array", "Array types");

			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, arrayElement, blockGroup, false, 2);
		}
	}
	else if (lastStage == glu::SHADERTYPE_TESSELLATION_CONTROL)
	{
		// arrayed interface
		const ResourceDefinition::Node::SharedPtr patchOutput(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_PATCH_OUT));

		// .var
		{
			const ResourceDefinition::Node::SharedPtr	arrayElem		(new ResourceDefinition::ArrayElement(output, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			tcu::TestCaseGroup* const					blockGroup		= new TestCaseGroup(context, "basic_type", "Basic types");

			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, arrayElem, blockGroup, true, 2);
		}
		// extension forbids use arrays of structs
		// extension forbids use arrays of arrays

		// .patch_var
		{
			tcu::TestCaseGroup* const					blockGroup		= new TestCaseGroup(context, "patch_var", "Basic types, per-patch");

			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, patchOutput, blockGroup, true, 1);
		}
		// .patch_var_struct
		{
			const ResourceDefinition::Node::SharedPtr	structMbr		(new ResourceDefinition::StructMember(patchOutput));
			tcu::TestCaseGroup* const					blockGroup		= new TestCaseGroup(context, "patch_var_struct", "Struct types, per-patch");

			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, structMbr, blockGroup, true, 1);
		}
		// .patch_var_array
		{
			const ResourceDefinition::Node::SharedPtr	arrayElem		(new ResourceDefinition::ArrayElement(patchOutput));
			tcu::TestCaseGroup* const					blockGroup		= new TestCaseGroup(context, "patch_var_array", "Array types, per-patch");

			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, arrayElem, blockGroup, true, 1);
		}
	}
	else if (lastStage == glu::SHADERTYPE_COMPUTE)
	{
		// nada
	}
	else
		DE_ASSERT(false);
}